

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathCmpNodes(xmlNodePtr node1,xmlNodePtr node2)

{
  xmlElementType xVar1;
  xmlElementType xVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  _xmlNode *p_Var5;
  int iVar6;
  xmlNodePtr pxVar7;
  int iVar8;
  int iVar9;
  xmlNodePtr pxVar10;
  int iVar11;
  _xmlNode *p_Var12;
  _xmlNode *p_Var13;
  xmlNodePtr pxVar14;
  
  iVar8 = -2;
  if (node2 == (xmlNodePtr)0x0 || node1 == (xmlNodePtr)0x0) {
    return -2;
  }
  if (node1 == node2) {
    return 0;
  }
  xVar1 = node1->type;
  if (xVar1 != XML_ATTRIBUTE_NODE) {
    pxVar10 = (_xmlNode *)0x0;
  }
  else {
    pxVar10 = node1;
    node1 = node1->parent;
  }
  xVar2 = node2->type;
  if (xVar2 != XML_ATTRIBUTE_NODE) {
    p_Var13 = (xmlNodePtr)0x0;
    p_Var12 = node2;
  }
  else {
    p_Var12 = node2->parent;
    p_Var13 = node2;
  }
  if (node1 == p_Var12) {
    if ((xVar1 == XML_ATTRIBUTE_NODE) != (xVar2 == XML_ATTRIBUTE_NODE)) {
      return (uint)(xVar2 == XML_ATTRIBUTE_NODE) * 2 + -1;
    }
    if (xVar1 == XML_ATTRIBUTE_NODE) {
      do {
        p_Var13 = p_Var13->prev;
        if (p_Var13 == (_xmlNode *)0x0) {
          return -1;
        }
      } while (p_Var13 != pxVar10);
      return 1;
    }
    return 0;
  }
  if (((node1->type == XML_NAMESPACE_DECL) || (p_Var12->type == XML_NAMESPACE_DECL)) ||
     (node1 == p_Var12->prev)) {
LAB_001d66c6:
    iVar8 = 1;
  }
  else {
    if (node1 == p_Var12->next) {
      return -1;
    }
    if (((node1->type == XML_ELEMENT_NODE) && (p_Var12->type == XML_ELEMENT_NODE)) &&
       ((pxVar3 = node1->content, (long)pxVar3 < 0 &&
        ((pxVar4 = p_Var12->content, (long)pxVar4 < 0 && (node1->doc == p_Var12->doc)))))) {
      if ((long)pxVar4 < (long)pxVar3) goto LAB_001d66c6;
      if ((long)pxVar3 < (long)pxVar4) {
        return -1;
      }
    }
    iVar9 = 0;
    iVar11 = 0;
    pxVar10 = p_Var12;
    if (p_Var12->parent != (xmlNodePtr)0x0) {
      iVar11 = 0;
      pxVar14 = p_Var12->parent;
      do {
        pxVar10 = pxVar14;
        if (pxVar10 == node1) goto LAB_001d66c6;
        iVar11 = iVar11 + 1;
        pxVar14 = pxVar10->parent;
      } while (pxVar10->parent != (_xmlNode *)0x0);
    }
    pxVar14 = node1;
    if (node1->parent != (xmlNodePtr)0x0) {
      iVar9 = 0;
      pxVar7 = node1->parent;
      do {
        pxVar14 = pxVar7;
        if (pxVar14 == p_Var12) {
          return -1;
        }
        iVar9 = iVar9 + 1;
        pxVar7 = pxVar14->parent;
      } while (pxVar14->parent != (_xmlNode *)0x0);
    }
    iVar6 = iVar9;
    if (pxVar10 == pxVar14) {
      for (; iVar11 < iVar9; iVar9 = iVar9 + -1) {
        node1 = node1->parent;
        iVar6 = iVar11;
      }
      for (; iVar6 < iVar11; iVar11 = iVar11 + -1) {
        p_Var12 = p_Var12->parent;
      }
      do {
        p_Var13 = node1->parent;
        p_Var5 = p_Var12->parent;
        if (p_Var13 == p_Var5) {
          if (node1 == p_Var12->prev) goto LAB_001d66c6;
          if (node1 == p_Var12->next) {
            return -1;
          }
          if ((((node1->type != XML_ELEMENT_NODE) || (p_Var12->type != XML_ELEMENT_NODE)) ||
              (pxVar3 = node1->content, -1 < (long)pxVar3)) ||
             ((pxVar4 = p_Var12->content, -1 < (long)pxVar4 || (node1->doc != p_Var12->doc))))
          goto LAB_001d66b1;
          if ((long)pxVar3 <= (long)pxVar4) {
            if ((long)pxVar3 < (long)pxVar4) {
              return -1;
            }
LAB_001d66b1:
            do {
              node1 = node1->next;
              if (node1 == (_xmlNode *)0x0) {
                return -1;
              }
            } while (node1 != p_Var12);
          }
          goto LAB_001d66c6;
        }
      } while ((p_Var13 != (_xmlNode *)0x0) &&
              (p_Var12 = p_Var5, node1 = p_Var13, p_Var5 != (_xmlNode *)0x0));
    }
  }
  return iVar8;
}

Assistant:

int
xmlXPathCmpNodes(xmlNodePtr node1, xmlNodePtr node2) {
    int depth1, depth2;
    int attr1 = 0, attr2 = 0;
    xmlNodePtr attrNode1 = NULL, attrNode2 = NULL;
    xmlNodePtr cur, root;

    if ((node1 == NULL) || (node2 == NULL))
	return(-2);
    /*
     * a couple of optimizations which will avoid computations in most cases
     */
    if (node1 == node2)		/* trivial case */
	return(0);
    if (node1->type == XML_ATTRIBUTE_NODE) {
	attr1 = 1;
	attrNode1 = node1;
	node1 = node1->parent;
    }
    if (node2->type == XML_ATTRIBUTE_NODE) {
	attr2 = 1;
	attrNode2 = node2;
	node2 = node2->parent;
    }
    if (node1 == node2) {
	if (attr1 == attr2) {
	    /* not required, but we keep attributes in order */
	    if (attr1 != 0) {
	        cur = attrNode2->prev;
		while (cur != NULL) {
		    if (cur == attrNode1)
		        return (1);
		    cur = cur->prev;
		}
		return (-1);
	    }
	    return(0);
	}
	if (attr2 == 1)
	    return(1);
	return(-1);
    }
    if ((node1->type == XML_NAMESPACE_DECL) ||
        (node2->type == XML_NAMESPACE_DECL))
	return(1);
    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);

    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > (ptrdiff_t) node1->content) &&
	(0 > (ptrdiff_t) node2->content) &&
	(node1->doc == node2->doc)) {
	ptrdiff_t l1, l2;

	l1 = -((ptrdiff_t) node1->content);
	l2 = -((ptrdiff_t) node2->content);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

    /*
     * compute depth to root
     */
    for (depth2 = 0, cur = node2;cur->parent != NULL;cur = cur->parent) {
	if (cur->parent == node1)
	    return(1);
	depth2++;
    }
    root = cur;
    for (depth1 = 0, cur = node1;cur->parent != NULL;cur = cur->parent) {
	if (cur->parent == node2)
	    return(-1);
	depth1++;
    }
    /*
     * Distinct document (or distinct entities :-( ) case.
     */
    if (root != cur) {
	return(-2);
    }
    /*
     * get the nearest common ancestor.
     */
    while (depth1 > depth2) {
	depth1--;
	node1 = node1->parent;
    }
    while (depth2 > depth1) {
	depth2--;
	node2 = node2->parent;
    }
    while (node1->parent != node2->parent) {
	node1 = node1->parent;
	node2 = node2->parent;
	/* should not happen but just in case ... */
	if ((node1 == NULL) || (node2 == NULL))
	    return(-2);
    }
    /*
     * Find who's first.
     */
    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);
    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > (ptrdiff_t) node1->content) &&
	(0 > (ptrdiff_t) node2->content) &&
	(node1->doc == node2->doc)) {
	ptrdiff_t l1, l2;

	l1 = -((ptrdiff_t) node1->content);
	l2 = -((ptrdiff_t) node2->content);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

    for (cur = node1->next;cur != NULL;cur = cur->next)
	if (cur == node2)
	    return(1);
    return(-1); /* assume there is no sibling list corruption */
}